

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxx.cpp
# Opt level: O0

bool mg::data::is_nxx_data(string_view *in)

{
  int iVar1;
  size_type sVar2;
  const_pointer pvVar3;
  undefined8 local_28;
  Nxx header;
  string_view *in_local;
  
  header._8_8_ = in;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(in);
  if (sVar2 < 0x10) {
    fprintf(_stderr,"NXX file too small\n");
    in_local._7_1_ = false;
  }
  else {
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)header._8_8_);
    local_28 = *(undefined8 *)pvVar3;
    header._0_8_ = *(undefined8 *)(pvVar3 + 8);
    iVar1 = strncmp((char *)&local_28,MAGIC_NXCX,4);
    if (iVar1 == 0) {
      in_local._7_1_ = true;
    }
    else {
      iVar1 = strncmp((char *)&local_28,MAGIC_NXGX,4);
      if (iVar1 == 0) {
        in_local._7_1_ = true;
      }
      else {
        in_local._7_1_ = false;
      }
    }
  }
  return in_local._7_1_;
}

Assistant:

bool is_nxx_data(const std::string_view &in) {
  // Test big enough to have header
  if (in.size() < sizeof(Nxx)) {
    fprintf(stderr, "NXX file too small\n");
    return false;
  }

  // Check for known file magic
  Nxx header = *reinterpret_cast<const Nxx *>(in.data());

  if (!strncmp(header.magic, MAGIC_NXCX, sizeof(header.magic))) {
    return true;
  }

  if (!strncmp(header.magic, MAGIC_NXGX, sizeof(header.magic))) {
    return true;
  }

  return false;
}